

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O3

int ar_parse_common_header(ar *ar,archive_entry *entry,char *h)

{
  int extraout_EAX;
  uint64_t uVar1;
  char *pcVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  char *p;
  bool bVar8;
  
  uVar1 = ar_atol10(h + 0x10,0xc);
  archive_entry_set_mtime(entry,uVar1,0);
  uVar1 = ar_atol10(h + 0x1c,6);
  archive_entry_set_uid(entry,uVar1 & 0xffffffff);
  uVar1 = ar_atol10(h + 0x22,6);
  archive_entry_set_gid(entry,uVar1 & 0xffffffff);
  pcVar2 = h + 0x28;
  p = h + 0x30;
  iVar3 = 8;
  while( true ) {
    cVar4 = *pcVar2;
    if ((cVar4 != ' ') && (cVar4 != '\t')) goto LAB_003f4c71;
    bVar8 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar8) break;
    pcVar2 = pcVar2 + 1;
  }
  cVar4 = *p;
  iVar3 = -1;
  pcVar2 = p;
LAB_003f4c71:
  uVar5 = (int)cVar4 - 0x30;
  uVar6 = 0;
  if (uVar5 < 8 && '/' < cVar4) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      if (iVar3 == (int)lVar7) break;
      if (uVar6 >> 0x3d != 0) {
        uVar6 = 0xffffffffffffffff;
        break;
      }
      uVar6 = (ulong)uVar5 + uVar6 * 8;
      if (pcVar2[lVar7 + 1] < 0x30) break;
      uVar5 = (int)pcVar2[lVar7 + 1] - 0x30;
      lVar7 = lVar7 + 1;
    } while (uVar5 < 8);
  }
  archive_entry_set_mode(entry,(mode_t)uVar6);
  uVar1 = ar_atol10(p,10);
  ar->entry_offset = 0;
  ar->entry_padding = (ulong)((uint)uVar1 & 1);
  archive_entry_set_size(entry,uVar1);
  ar->entry_bytes_remaining = uVar1;
  return extraout_EAX;
}

Assistant:

static int
ar_parse_common_header(struct ar *ar, struct archive_entry *entry,
    const char *h)
{
	uint64_t n;

	/* Copy remaining header */
	archive_entry_set_mtime(entry,
	    (time_t)ar_atol10(h + AR_date_offset, AR_date_size), 0L);
	archive_entry_set_uid(entry,
	    (uid_t)ar_atol10(h + AR_uid_offset, AR_uid_size));
	archive_entry_set_gid(entry,
	    (gid_t)ar_atol10(h + AR_gid_offset, AR_gid_size));
	archive_entry_set_mode(entry,
	    (mode_t)ar_atol8(h + AR_mode_offset, AR_mode_size));
	n = ar_atol10(h + AR_size_offset, AR_size_size);

	ar->entry_offset = 0;
	ar->entry_padding = n % 2;
	archive_entry_set_size(entry, n);
	ar->entry_bytes_remaining = n;
	return (ARCHIVE_OK);
}